

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::router::
register_handler<false,void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>)>
          (router *this,string *name,_func_void_weak_ptr<rest_rpc::rpc_service::connection> *f,
          bool pub)

{
  iterator iVar1;
  invalid_argument *this_00;
  uint32_t key;
  
  key = MD5::MD5Hash32((name->_M_dataplus)._M_p);
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->key2func_name_)._M_h,&key);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->key2func_name_,&key,name);
    register_nonmember_func<false,void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>)>
              (this,key,f);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"duplicate registration key !");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void register_handler(std::string const &name, Function f, bool pub = false) {
    uint32_t key = MD5::MD5Hash32(name.data());
    if (key2func_name_.find(key) != key2func_name_.end()) {
      throw std::invalid_argument("duplicate registration key !");
    } else {
      key2func_name_.emplace(key, name);
      return register_nonmember_func<is_pub>(key, std::move(f));
    }
  }